

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

void write_section(char *section_name)

{
  char **ppcVar1;
  FILE *__stream;
  int iVar2;
  section *local_30;
  section *sl;
  int i;
  FILE *fp;
  char **section;
  char *section_name_local;
  
  local_30 = section_list;
  while ((local_30->name != (char *)0x0 && (iVar2 = strcmp(local_30->name,section_name), iVar2 != 0)
         )) {
    local_30 = local_30 + 1;
  }
  __stream = code_file;
  if (local_30->name == (char *)0x0) {
    fprintf(_stderr,"Cannot find section \'%s\' in your skeleton file\n",section_name);
    exit(1);
  }
  ppcVar1 = local_30->ptr;
  for (sl._4_4_ = (uint)(lflag != '\0'); ppcVar1[(int)sl._4_4_] != (char *)0x0;
      sl._4_4_ = sl._4_4_ + 1) {
    outline = outline + 1;
    fprintf((FILE *)__stream,"%s\n",ppcVar1[(int)sl._4_4_]);
  }
  return;
}

Assistant:

void write_section(char *section_name)
{
    char **section;
    FILE *fp;
    int i;
    struct section *sl;

    for(sl=&section_list[0]; sl->name; sl++) {
      if(strcmp(sl->name,section_name)==0) {
	break;
      }
    }
    if(sl->name==0) {
      fprintf(stderr, "Cannot find section '%s' in your skeleton file\n", section_name);
      exit(1);
    }

    section =  sl->ptr;
    fp = code_file;
    for (i = lflag ? 1 : 0; section[i]; ++i)
    {
	++outline;
	fprintf(fp, "%s\n", section[i]);
    }
}